

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::lookup<false>
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,char *begin,char *end,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator,Lattice *lattice)

{
  Token *pTVar1;
  pointer ppVar2;
  long lVar3;
  short sVar4;
  size_t sVar5;
  unsigned_short uVar6;
  CharInfo CVar7;
  int iVar8;
  CharInfo CVar9;
  uint uVar10;
  CharInfo CVar11;
  mecab_learner_node_t *__s;
  char *pcVar12;
  mecab_learner_node_t *pmVar13;
  result_pair_type *prVar14;
  pointer ppDVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  char *p;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  uint *puVar22;
  undefined1 auVar23 [16];
  size_t mblen;
  int local_a0;
  size_t local_88;
  result_pair_type *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  CharProperty *local_60;
  result_pair_type *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_88 = 0;
  pcVar12 = begin + 0xffff;
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    pcVar12 = end;
  }
  local_60 = &this->property_;
  pcVar21 = begin;
  if (pcVar12 == begin) {
    CVar7 = (CharInfo)0x0;
  }
  else {
    CVar11 = this->space_;
    do {
      CVar7 = CharProperty::getCharInfo(local_60,pcVar21,pcVar12,&local_88);
      if (((uint)CVar11 & (uint)CVar7 & 0x3ffff) == 0) break;
      pcVar21 = pcVar21 + local_88;
      CVar11 = CVar7;
    } while (pcVar21 != pcVar12);
  }
  ppDVar15 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = pcVar12;
  local_68 = begin;
  if (ppDVar15 ==
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __s = (mecab_learner_node_t *)0x0;
  }
  else {
    prVar14 = *(result_pair_type **)(allocator + 0x70);
    local_38 = (long)pcVar12 - (long)pcVar21;
    local_40 = (long)pcVar21 - (long)begin;
    __s = (mecab_learner_node_t *)0x0;
    local_48 = CONCAT44(local_48._4_4_,(uint)CVar7 >> 0x12);
    local_58 = prVar14;
    do {
      local_50 = (char *)Darts::
                         DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                         ::
                         commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                                   ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                                     *)&(*ppDVar15)->da_,pcVar21,prVar14,0x200,local_38,0);
      if (local_50 != (char *)0x0) {
        pcVar12 = (char *)0x0;
        do {
          local_80 = (result_pair_type *)((long)pcVar12 * 0x10);
          uVar10 = prVar14[(long)pcVar12].value;
          local_70 = pcVar12;
          if ((uVar10 & 0xff) != 0) {
            local_80 = prVar14 + (long)pcVar12;
            iVar8 = (int)uVar10 >> 8;
            pTVar1 = (*ppDVar15)->token_;
            uVar19 = 0;
            pmVar13 = __s;
            do {
              __s = FreeList<mecab_learner_node_t>::alloc
                              (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
              memset(__s,0,0x98);
              lVar16 = *(long *)(allocator + 8);
              *(long *)(allocator + 8) = lVar16 + 1;
              __s->id = (uint)lVar16;
              pcVar12 = (*ppDVar15)->feature_;
              auVar23 = ZEXT416(*(uint *)((long)&pTVar1[iVar8].lcAttr + uVar19));
              auVar23 = pshuflw(auVar23,auVar23,0xe1);
              __s->rcAttr = (short)auVar23._0_4_;
              __s->lcAttr = (short)((uint)auVar23._0_4_ >> 0x10);
              __s->posid = *(unsigned_short *)((long)&pTVar1[iVar8].posid + uVar19);
              __s->wcost2 = *(short *)((long)&pTVar1[iVar8].wcost + uVar19);
              __s->feature = pcVar12 + *(uint *)((long)&pTVar1[iVar8].feature + uVar19);
              uVar6 = (unsigned_short)local_80->length;
              __s->length = uVar6;
              __s->rlength = uVar6 + (short)local_40;
              __s->surface = pcVar21;
              __s->char_type = (uchar)local_48;
              __s->bnext = pmVar13;
              uVar19 = uVar19 + 0x10;
              pmVar13 = __s;
            } while ((uVar10 & 0xff) << 4 != uVar19);
          }
          pcVar12 = local_70 + 1;
          prVar14 = local_58;
        } while (pcVar12 != local_50);
      }
      ppDVar15 = ppDVar15 + 1;
    } while (ppDVar15 !=
             (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if ((-1 < (int)CVar7) && (__s != (mecab_learner_node_t *)0x0)) {
      return __s;
    }
  }
  pcVar18 = local_78;
  sVar5 = local_88;
  pcVar12 = pcVar21 + local_88;
  if (local_78 < pcVar12) {
    ppVar2 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = (ulong)((uint)CVar7 >> 0xe & 0xff0);
    lVar16 = *(long *)((long)&ppVar2->second + uVar19);
    if (lVar16 != 0) {
      sVar4 = (short)local_68;
      puVar22 = (uint *)(*(long *)((long)&ppVar2->first + uVar19) + 8);
      do {
        pmVar13 = FreeList<mecab_learner_node_t>::alloc
                            (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
        memset(pmVar13,0,0x98);
        lVar3 = *(long *)(allocator + 8);
        *(long *)(allocator + 8) = lVar3 + 1;
        pmVar13->id = (uint)lVar3;
        pcVar18 = (this->unkdic_).feature_;
        auVar23 = pshuflw(ZEXT416(puVar22[-2]),ZEXT416(puVar22[-2]),0xe1);
        pmVar13->rcAttr = (short)auVar23._0_4_;
        pmVar13->lcAttr = (short)((uint)auVar23._0_4_ >> 0x10);
        pmVar13->posid = (unsigned_short)puVar22[-1];
        pmVar13->wcost2 = *(short *)((long)puVar22 + -2);
        pmVar13->feature = pcVar18 + *puVar22;
        pmVar13->char_type = (uchar)((uint)CVar7 >> 0x12);
        pmVar13->surface = pcVar21;
        pmVar13->length = (unsigned_short)sVar5;
        pmVar13->rlength = (short)pcVar12 - sVar4;
        pmVar13->stat = '\x01';
        pmVar13->bnext = __s;
        pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar18 != (char *)0x0) {
          pmVar13->feature = pcVar18;
        }
        puVar22 = puVar22 + 4;
        lVar16 = lVar16 + -1;
        __s = pmVar13;
      } while (lVar16 != 0);
      return pmVar13;
    }
    if (__s != (mecab_learner_node_t *)0x0) {
      return __s;
    }
  }
  local_a0 = (int)pcVar21;
  if (((uint)CVar7 >> 0x1e & 1) == 0) {
    pcVar20 = (char *)0x0;
  }
  else {
    pcVar17 = local_78;
    if (pcVar12 != local_78) {
      uVar19 = 0;
      pcVar20 = pcVar12;
      CVar11 = CVar7;
      do {
        CVar9 = CharProperty::getCharInfo(local_60,pcVar20,pcVar18,&local_88);
        pcVar17 = pcVar20;
        if (((uint)CVar11 & (uint)CVar9 & 0x3ffff) == 0) break;
        pcVar20 = pcVar20 + local_88;
        uVar19 = uVar19 + 1;
        pcVar17 = pcVar18;
        CVar11 = CVar9;
      } while (pcVar20 != pcVar18);
      pcVar20 = pcVar17;
      if (this->max_grouping_size_ < uVar19) goto LAB_001283c0;
    }
    ppVar2 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = (ulong)((uint)CVar7 >> 0xe & 0xff0);
    lVar16 = *(long *)((long)&ppVar2->second + uVar19);
    pcVar20 = pcVar17;
    if (lVar16 != 0) {
      local_80 = (result_pair_type *)CONCAT44(local_80._4_4_,(int)pcVar17 - local_a0);
      sVar4 = (short)local_68;
      puVar22 = (uint *)(*(long *)((long)&ppVar2->first + uVar19) + 8);
      pmVar13 = __s;
      local_70 = pcVar17;
      do {
        __s = FreeList<mecab_learner_node_t>::alloc
                        (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
        memset(__s,0,0x98);
        lVar3 = *(long *)(allocator + 8);
        *(long *)(allocator + 8) = lVar3 + 1;
        __s->id = (uint)lVar3;
        pcVar18 = (this->unkdic_).feature_;
        auVar23 = pshuflw(ZEXT416(puVar22[-2]),ZEXT416(puVar22[-2]),0xe1);
        __s->rcAttr = (short)auVar23._0_4_;
        __s->lcAttr = (short)((uint)auVar23._0_4_ >> 0x10);
        __s->posid = (unsigned_short)puVar22[-1];
        __s->wcost2 = *(short *)((long)puVar22 + -2);
        __s->feature = pcVar18 + *puVar22;
        __s->char_type = (uchar)((uint)CVar7 >> 0x12);
        __s->surface = pcVar21;
        __s->length = (unsigned_short)local_80;
        __s->rlength = (short)pcVar17 - sVar4;
        __s->stat = '\x01';
        __s->bnext = pmVar13;
        pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar18 != (char *)0x0) {
          __s->feature = pcVar18;
        }
        puVar22 = puVar22 + 4;
        lVar16 = lVar16 + -1;
        pmVar13 = __s;
        pcVar20 = local_70;
        pcVar18 = local_78;
      } while (lVar16 != 0);
    }
  }
LAB_001283c0:
  uVar10 = (uint)CVar7 >> 0x1a & 0xf;
  local_48 = (ulong)uVar10;
  if ((uVar10 != 0) && (pcVar12 <= pcVar18)) {
    local_80 = (result_pair_type *)CONCAT44(local_80._4_4_,(uint)CVar7 >> 0x12);
    local_50 = (char *)(CONCAT44(local_50._4_4_,CVar7) & 0xffffffff0003ffff);
    uVar19 = 1;
    prVar14 = (result_pair_type *)(ulong)(((uint)CVar7 >> 0x12 & 0xff) << 4);
    local_70 = pcVar20;
    local_58 = prVar14;
    do {
      if (pcVar12 != pcVar20) {
        ppVar2 = (this->unk_tokens_).
                 super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar16 = *(long *)((long)&prVar14->length + (long)ppVar2);
        local_40 = uVar19;
        if (lVar16 != 0) {
          sVar4 = (short)local_68;
          puVar22 = (uint *)(*(long *)((long)&prVar14->value + (long)ppVar2) + 8);
          pmVar13 = __s;
          do {
            __s = FreeList<mecab_learner_node_t>::alloc
                            (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
            memset(__s,0,0x98);
            lVar3 = *(long *)(allocator + 8);
            *(long *)(allocator + 8) = lVar3 + 1;
            __s->id = (uint)lVar3;
            pcVar18 = (this->unkdic_).feature_;
            auVar23 = pshuflw(ZEXT416(puVar22[-2]),ZEXT416(puVar22[-2]),0xe1);
            __s->rcAttr = (short)auVar23._0_4_;
            __s->lcAttr = (short)((uint)auVar23._0_4_ >> 0x10);
            __s->posid = (unsigned_short)puVar22[-1];
            __s->wcost2 = *(short *)((long)puVar22 + -2);
            __s->feature = pcVar18 + *puVar22;
            __s->char_type = (uchar)local_80;
            __s->surface = pcVar21;
            __s->length = (short)pcVar12 - (short)pcVar21;
            __s->rlength = (short)pcVar12 - sVar4;
            __s->stat = '\x01';
            __s->bnext = pmVar13;
            pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar18 != (char *)0x0) {
              __s->feature = pcVar18;
            }
            puVar22 = puVar22 + 4;
            lVar16 = lVar16 + -1;
            pmVar13 = __s;
          } while (lVar16 != 0);
        }
        CVar11 = CharProperty::getCharInfo(local_60,pcVar12,local_78,&local_88);
        if (((uint)local_50 & (uint)CVar11) == 0) break;
        pcVar12 = pcVar12 + local_88;
        prVar14 = local_58;
        uVar19 = local_40;
        pcVar20 = local_70;
        pcVar18 = local_78;
      }
      if ((local_48 <= uVar19) || (uVar19 = uVar19 + 1, pcVar18 < pcVar12)) break;
    } while( true );
  }
  if (__s == (mecab_learner_node_t *)0x0) {
    ppVar2 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = (ulong)((uint)CVar7 >> 0xe & 0xff0);
    lVar16 = *(long *)((long)&ppVar2->second + uVar19);
    if (lVar16 == 0) {
      __s = (mecab_learner_node_t *)0x0;
    }
    else {
      sVar4 = (short)local_68;
      puVar22 = (uint *)(*(long *)((long)&ppVar2->first + uVar19) + 8);
      pmVar13 = (mecab_learner_node_t *)0x0;
      do {
        __s = FreeList<mecab_learner_node_t>::alloc
                        (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
        memset(__s,0,0x98);
        lVar3 = *(long *)(allocator + 8);
        *(long *)(allocator + 8) = lVar3 + 1;
        __s->id = (uint)lVar3;
        pcVar18 = (this->unkdic_).feature_;
        auVar23 = pshuflw(ZEXT416(puVar22[-2]),ZEXT416(puVar22[-2]),0xe1);
        __s->rcAttr = (short)auVar23._0_4_;
        __s->lcAttr = (short)((uint)auVar23._0_4_ >> 0x10);
        __s->posid = (unsigned_short)puVar22[-1];
        __s->wcost2 = *(short *)((long)puVar22 + -2);
        __s->feature = pcVar18 + *puVar22;
        __s->char_type = (uchar)((uint)CVar7 >> 0x12);
        __s->surface = pcVar21;
        __s->length = (short)pcVar12 - (short)pcVar21;
        __s->rlength = (short)pcVar12 - sVar4;
        __s->stat = '\x01';
        __s->bnext = pmVar13;
        pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar18 != (char *)0x0) {
          __s->feature = pcVar18;
        }
        puVar22 = puVar22 + 4;
        lVar16 = lVar16 + -1;
        pmVar13 = __s;
      } while (lVar16 != 0);
    }
  }
  return __s;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}